

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O1

DefaultNamerDisposer *
ApprovalTests::TemplatedCustomNamer::useAsDefaultNamer
          (DefaultNamerDisposer *__return_storage_ptr__,string *templateString)

{
  pointer pcVar1;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  pcVar1 = (templateString->_M_dataplus)._M_p;
  local_58 = &local_48;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + templateString->_M_string_length);
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x20);
  *(code **)local_38._M_unused._0_8_ = (code *)((long)local_38._M_unused._0_8_ + 0x10);
  if (local_58 == &local_48) {
    *(ulong *)((long)local_38._M_unused._0_8_ + 0x10) = CONCAT71(uStack_47,local_48);
    *(undefined8 *)((long)local_38._M_unused._0_8_ + 0x18) = uStack_40;
  }
  else {
    *(undefined1 **)local_38._M_unused._0_8_ = local_58;
    *(ulong *)((long)local_38._M_unused._0_8_ + 0x10) = CONCAT71(uStack_47,local_48);
  }
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = local_50;
  local_50 = 0;
  local_48 = 0;
  pcStack_20 = ::std::
               _Function_handler<std::shared_ptr<ApprovalTests::ApprovalNamer>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:97:45)>
               ::_M_invoke;
  local_28 = ::std::
             _Function_handler<std::shared_ptr<ApprovalTests::ApprovalNamer>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:97:45)>
             ::_M_manager;
  local_58 = &local_48;
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
  useAsDefaultNamer(__return_storage_ptr__,(NamerCreator *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

DefaultNamerDisposer
    TemplatedCustomNamer::useAsDefaultNamer(std::string templateString)
    {
        return Approvals::useAsDefaultNamer([=]() { return create(templateString); });
    }